

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<capnp::SchemaParser::ModuleImpl> * __thiscall
kj::Own<capnp::SchemaParser::ModuleImpl>::operator=
          (Own<capnp::SchemaParser::ModuleImpl> *this,Own<capnp::SchemaParser::ModuleImpl> *other)

{
  Disposer *this_00;
  ModuleImpl *object;
  ModuleImpl *ptrCopy;
  Disposer *disposerCopy;
  Own<capnp::SchemaParser::ModuleImpl> *other_local;
  Own<capnp::SchemaParser::ModuleImpl> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (ModuleImpl *)0x0;
  if (object != (ModuleImpl *)0x0) {
    Disposer::dispose<capnp::SchemaParser::ModuleImpl>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }